

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2closest_edge_query_base.h
# Opt level: O0

void __thiscall
S2ClosestEdgeQueryBase<S2MaxDistance>::ReInit(S2ClosestEdgeQueryBase<S2MaxDistance> *this)

{
  S2ClosestEdgeQueryBase<S2MaxDistance> *this_local;
  
  this->index_num_edges_ = 0;
  this->index_num_edges_limit_ = 0;
  std::vector<S2CellId,_std::allocator<S2CellId>_>::clear(&this->index_covering_);
  absl::InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>::
  clear(&this->index_cells_);
  return;
}

Assistant:

void S2ClosestEdgeQueryBase<Distance>::ReInit() {
  index_num_edges_ = 0;
  index_num_edges_limit_ = 0;
  index_covering_.clear();
  index_cells_.clear();
  // We don't initialize iter_ here to make queries on small indexes a bit
  // faster (i.e., where brute force is used).
}